

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::BeginValue(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             *this,Context *context)

{
  ValueType *this_00;
  Ch *pCVar1;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if ((context->inArray & 1U) != 0) {
    if ((this->uniqueItems_ & 1U) != 0) {
      context->valueUniqueness = true;
    }
    if (this->itemsList_ == (SchemaType *)0x0) {
      if (this->itemsTuple_ == (SchemaType **)0x0) {
        context->valueSchema = this->typeless_;
      }
      else if (context->arrayElementIndex < this->itemsTupleCount_) {
        context->valueSchema = this->itemsTuple_[context->arrayElementIndex];
      }
      else if (this->additionalItemsSchema_ == (SchemaType *)0x0) {
        if ((this->additionalItems_ & 1U) == 0) {
          (*context->error_handler->_vptr_IValidationErrorHandler[0xe])
                    (context->error_handler,(ulong)context->arrayElementIndex);
          context->valueSchema = this->typeless_;
          context->arrayElementIndex = context->arrayElementIndex + 1;
          context->invalidCode = kValidateErrorAdditionalItems;
          this_00 = GetValidateErrorKeyword(kValidateErrorAdditionalItems);
          pCVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(this_00);
          context->invalidKeyword = pCVar1;
          return false;
        }
        context->valueSchema = this->typeless_;
      }
      else {
        context->valueSchema = this->additionalItemsSchema_;
      }
    }
    else {
      context->valueSchema = this->itemsList_;
    }
    context->arrayElementIndex = context->arrayElementIndex + 1;
  }
  return true;
}

Assistant:

bool BeginValue(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::BeginValue");
        if (context.inArray) {
            if (uniqueItems_)
                context.valueUniqueness = true;

            if (itemsList_)
                context.valueSchema = itemsList_;
            else if (itemsTuple_) {
                if (context.arrayElementIndex < itemsTupleCount_)
                    context.valueSchema = itemsTuple_[context.arrayElementIndex];
                else if (additionalItemsSchema_)
                    context.valueSchema = additionalItemsSchema_;
                else if (additionalItems_)
                    context.valueSchema = typeless_;
                else {
                    context.error_handler.DisallowedItem(context.arrayElementIndex);
                    // Must set valueSchema for when kValidateContinueOnErrorFlag is set, else reports spurious type error
                    context.valueSchema = typeless_;
                    // Must bump arrayElementIndex for when kValidateContinueOnErrorFlag is set
                    context.arrayElementIndex++;
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAdditionalItems);
                }
            }
            else
                context.valueSchema = typeless_;

            context.arrayElementIndex++;
        }
        return true;
    }